

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

int __thiscall
anon_unknown.dwarf_362a19::TransformSelectorIndexes::NormalizeIndex
          (TransformSelectorIndexes *this,int index,size_t count)

{
  ostream *poVar1;
  transform_error *this_00;
  uint uVar2;
  string local_1c0;
  ostringstream str;
  
  uVar2 = (index >> 0x1f & (uint)count) + index;
  if ((-1 < (int)uVar2) && (uVar2 < count)) {
    return uVar2;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  poVar1 = std::operator<<((ostream *)&str,"sub-command TRANSFORM, selector ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_TransformSelector).Tag);
  poVar1 = std::operator<<(poVar1,", index: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1," out of range (-");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,").");
  this_00 = (transform_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  transform_error::transform_error(this_00,&local_1c0);
  __cxa_throw(this_00,&(anonymous_namespace)::transform_error::typeinfo,
              std::runtime_error::~runtime_error);
}

Assistant:

int NormalizeIndex(int index, std::size_t count)
  {
    if (index < 0) {
      index = static_cast<int>(count) + index;
    }
    if (index < 0 || count <= static_cast<std::size_t>(index)) {
      std::ostringstream str;
      str << "sub-command TRANSFORM, selector " << this->Tag
          << ", index: " << index << " out of range (-" << count << ", "
          << count - 1 << ").";
      throw transform_error(str.str());
    }
    return index;
  }